

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

CharacterNode * __thiscall
icu_63::TextTrieMap::getChildNode(TextTrieMap *this,CharacterNode *parent,UChar c)

{
  CharacterNode *pCVar1;
  ushort uVar2;
  UChar UVar3;
  
  uVar2 = parent->fFirstChild;
  if (uVar2 != 0) {
    do {
      pCVar1 = this->fNodes + uVar2;
      UVar3 = this->fNodes[uVar2].fCharacter;
      if (UVar3 == c) {
        return pCVar1;
      }
    } while (((ushort)UVar3 <= (ushort)c) && (uVar2 = pCVar1->fNextSibling, uVar2 != 0));
  }
  return (CharacterNode *)0x0;
}

Assistant:

CharacterNode*
TextTrieMap::getChildNode(CharacterNode *parent, UChar c) const {
    // Linear search of the sorted list of children.
    uint16_t nodeIndex = parent->fFirstChild;
    while (nodeIndex > 0) {
        CharacterNode *current = fNodes + nodeIndex;
        UChar childCharacter = current->fCharacter;
        if (childCharacter == c) {
            return current;
        } else if (childCharacter > c) {
            break;
        }
        nodeIndex = current->fNextSibling;
    }
    return NULL;
}